

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O0

void Zyx_ManPrint(Zyx_Man_t *p,int Iter,int iMint,int nLazyAll,abctime clk)

{
  uint uVar1;
  abctime clk_local;
  uint local_18;
  int nLazyAll_local;
  int iMint_local;
  int Iter_local;
  Zyx_Man_t *p_local;
  
  local_18 = iMint;
  nLazyAll_local = Iter;
  _iMint_local = p;
  printf("Iter %6d : ",(ulong)(uint)Iter);
  Extra_PrintBinary(_stdout,&local_18,_iMint_local->pPars->nVars);
  printf("  ");
  uVar1 = bmcg_sat_solver_clausenum(_iMint_local->pSat);
  printf("Cla =%9d  ",(ulong)uVar1);
  printf("Lazy =%6d  ",(ulong)(uint)nLazyAll);
  uVar1 = bmcg_sat_solver_conflictnum(_iMint_local->pSat);
  printf("Conf =%9d  ",(ulong)uVar1);
  Abc_PrintTime(1,"Time",clk);
  return;
}

Assistant:

static inline void Zyx_ManPrint( Zyx_Man_t * p, int Iter, int iMint, int nLazyAll, abctime clk )
{
    printf( "Iter %6d : ", Iter );
    Extra_PrintBinary( stdout, (unsigned *)&iMint, p->pPars->nVars );
    printf( "  " );
    printf( "Cla =%9d  ", bmcg_sat_solver_clausenum(p->pSat) );
    printf( "Lazy =%6d  ", nLazyAll );
    printf( "Conf =%9d  ", bmcg_sat_solver_conflictnum(p->pSat) );
    Abc_PrintTime( 1, "Time", clk );
    //Zyx_ManEvalStats( p );
    //Abc_PrintTime( 1, "Eval", p->clkEval );
}